

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findfunction.cpp
# Opt level: O2

void comparator(string *gtn,string *ltn,string *eqt,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *b,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *c,int i)

{
  long lVar1;
  string *value;
  bool bVar2;
  long lVar3;
  allocator local_291;
  string *local_290;
  string *local_288;
  string *local_280;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_278;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  lVar3 = (long)i;
  lVar1 = lVar3 + 2;
  local_288 = ltn;
  local_278 = c;
  bVar2 = std::operator==((b->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + lVar1,">");
  local_280 = eqt;
  if (bVar2) {
    std::__cxx11::string::_M_assign((string *)gtn);
    local_290 = &local_50;
    std::__cxx11::string::string
              ((string *)local_290,
               (string *)
               ((b->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + lVar3 + 1));
    std::__cxx11::string::string
              ((string *)&local_110,
               (string *)
               ((b->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + lVar3 + 3));
    std::__cxx11::string::string((string *)&local_130,"<",&local_291);
    bVar2 = searchcomp(&local_50,&local_110,i,b,&local_130,local_288);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_50);
    if (bVar2) {
      searchwire(local_278,local_288,gtn);
    }
    local_290 = &local_70;
    std::__cxx11::string::string
              ((string *)local_290,
               (string *)
               ((b->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + lVar3 + 1));
    std::__cxx11::string::string
              ((string *)&local_150,
               (string *)
               ((b->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + lVar3 + 3));
    std::__cxx11::string::string((string *)&local_170,"==",&local_291);
    value = local_280;
    bVar2 = searchcomp(&local_70,&local_150,i,b,&local_170,local_280);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    bVar2 = std::operator==((b->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + lVar1,"<");
    if (bVar2) {
      local_290 = gtn;
      std::__cxx11::string::_M_assign((string *)local_288);
      std::__cxx11::string::string
                ((string *)&local_90,
                 (string *)
                 ((b->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + lVar3 + 1));
      std::__cxx11::string::string
                ((string *)&local_190,
                 (string *)
                 ((b->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + lVar3 + 3));
      std::__cxx11::string::string((string *)&local_1b0,">",&local_291);
      bVar2 = searchcomp(&local_90,&local_190,i,b,&local_1b0,local_290);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_90);
      if (bVar2) {
        searchwire(local_278,local_290,local_288);
      }
      std::__cxx11::string::string
                ((string *)&local_b0,
                 (string *)
                 ((b->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + lVar3 + 1));
      std::__cxx11::string::string
                ((string *)&local_1d0,
                 (string *)
                 ((b->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + lVar3 + 3));
      std::__cxx11::string::string((string *)&local_1f0,"==",&local_291);
      value = local_280;
      bVar2 = searchcomp(&local_b0,&local_1d0,i,b,&local_1f0,local_280);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_b0);
      gtn = local_288;
    }
    else {
      bVar2 = std::operator==((b->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + lVar1,"==");
      if (!bVar2) {
        return;
      }
      std::__cxx11::string::_M_assign((string *)eqt);
      std::__cxx11::string::string
                ((string *)&local_d0,
                 (string *)
                 ((b->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + lVar3 + 1));
      std::__cxx11::string::string
                ((string *)&local_210,
                 (string *)
                 ((b->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + lVar3 + 3));
      std::__cxx11::string::string((string *)&local_230,">",&local_291);
      bVar2 = searchcomp(&local_d0,&local_210,i,b,&local_230,gtn);
      local_290 = (string *)CONCAT71(local_290._1_7_,bVar2);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_d0);
      if ((char)local_290 != '\0') {
        searchwire(local_278,gtn,local_280);
      }
      std::__cxx11::string::string
                ((string *)&local_f0,
                 (string *)
                 ((b->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + lVar3 + 1));
      std::__cxx11::string::string
                ((string *)&local_250,
                 (string *)
                 ((b->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + lVar3 + 3));
      std::__cxx11::string::string((string *)&local_270,"<",&local_291);
      gtn = local_280;
      bVar2 = searchcomp(&local_f0,&local_250,i,b,&local_270,local_288);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_f0);
      value = local_288;
    }
  }
  if (bVar2) {
    searchwire(local_278,value,gtn);
  }
  return;
}

Assistant:

void comparator(string *gtn, string *ltn, string *eqt, vector<string> & b, vector<string> & c,int i)
{
	
	if (b[i + 2] == ">")
	{
		*gtn = b[i - 1];
		if (searchcomp(b[i + 1], b[i + 3], i, b, "<", ltn))			// search for lesser than condition
			searchwire(c, ltn,gtn);
		if( searchcomp(b[i+1], b[i + 3], i, b, "==",eqt))			//search for equal to condition
			searchwire(c, eqt, gtn);
	}
	else if (b[i + 2] == "<")
	{
		*ltn = b[i - 1];
		if (searchcomp(b[i+1], b[i + 3], i, b, ">", gtn))			// search for greater than condition
			searchwire(c, gtn, ltn);
		if (searchcomp(b[i + 1], b[i + 3], i, b, "==", eqt))			//search for equal to condition
			searchwire(c, eqt, ltn);
	}
	else if (b[i + 2] == "==")
	{
		*eqt = b[i - 1];
		if (searchcomp(b[i + 1], b[i + 3], i, b, ">", gtn))			// search for greater than condition
			searchwire(c, gtn, eqt);
		if (searchcomp(b[i + 1], b[i + 3], i, b, "<", ltn))			// search for lesser than condition
			searchwire(c, ltn, eqt);
	}

}